

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (string *__return_storage_ptr__,string_view prefix,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *rng,string_view suffix,string_view sep)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng_00;
  bool bVar1;
  void *local_188;
  void *local_180 [3];
  string_view local_168;
  void *local_158;
  void *local_150;
  void *local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_140;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *local_f8;
  undefined8 local_f0;
  string local_e8;
  string_view local_c8;
  string local_b8;
  void *local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  iterator local_48;
  undefined8 local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng_local;
  string_view suffix_local;
  string_view prefix_local;
  
  suffix_local._M_len = (size_t)suffix._M_str;
  rng_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)suffix._M_len;
  suffix_local._M_str = (char *)prefix._M_len;
  local_38 = rng;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(rng);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_98 = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::nullptr_t,_true>
              (&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str,
               &local_98);
    rng_00 = local_38;
    local_148 = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::nullptr_t,_true>
              (&local_140,(basic_string_view<char,_std::char_traits<char>_> *)&rng_local,&local_148)
    ;
    local_150 = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::nullptr_t,_true>
              (&local_128,&sep,&local_150);
    local_158 = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::nullptr_t,_true>
              (&local_110,(basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str,
               &local_158);
    local_f0 = 3;
    views._M_len = 3;
    views._M_array = &local_140;
    local_f8 = &local_140;
    cmCatViews(&local_e8,views);
    local_c8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168);
    cmJoin(&local_b8,rng_00,local_c8,local_168);
    local_180[0] = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t,_true>
              (&local_78,&local_b8,local_180);
    local_188 = (void *)0x0;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::nullptr_t,_true>
              (&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&rng_local,&local_188);
    local_48 = &local_90;
    local_40 = 3;
    views_00._M_len = 3;
    views_00._M_array = local_48;
    cmCatViews(__return_storage_ptr__,views_00);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(cm::string_view prefix, Range const& rng,
                   cm::string_view suffix, cm::string_view sep)
{
  if (rng.empty()) {
    return std::string();
  }
  return cmCatViews({ { prefix, nullptr },
                      { cmJoin(rng,
                               cmCatViews({ { suffix, nullptr },
                                            { sep, nullptr },
                                            { prefix, nullptr } })),
                        nullptr },
                      { suffix, nullptr } });
}